

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

Symbol * slang::ast::ClassType::fromSyntax(Scope *scope,ClassDeclarationSyntax *syntax)

{
  Compilation *args;
  Symbol *pSVar1;
  ClassType *this;
  SourceLocation local_40;
  string_view local_38;
  
  if ((syntax->parameters != (ParameterPortListSyntax *)0x0) &&
     ((syntax->parameters->declarations).elements._M_extent._M_extent_value != 0)) {
    pSVar1 = GenericClassDefSymbol::fromSyntax(scope,syntax);
    return pSVar1;
  }
  args = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  this = BumpAllocator::
         emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                   (&args->super_BumpAllocator,args,&local_38,&local_40);
  populate(this,scope,syntax);
  return (Symbol *)this;
}

Assistant:

const Symbol& ClassType::fromSyntax(const Scope& scope, const ClassDeclarationSyntax& syntax) {
    // If this class declaration has parameter ports it's actually a generic class definition.
    // Create that now and wait until someone specializes it in order to get an actual type.
    if (syntax.parameters && !syntax.parameters->declarations.empty())
        return GenericClassDefSymbol::fromSyntax(scope, syntax);

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ClassType>(comp, syntax.name.valueText(), syntax.name.location());
    result->populate(scope, syntax);
    return *result;
}